

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O2

bool BicTest3<Blob<128>,unsigned_long>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int out2;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int keybit;
  int iVar9;
  ulong uVar10;
  int out1;
  bool bVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined8 in_XMM7_Qb;
  uint local_b0;
  allocator_type local_a9;
  double local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  unsigned_long h2;
  unsigned_long h1;
  value_type_conflict1 local_6c;
  vector<int,_std::allocator<int>_> bins;
  Rand r;
  Blob<128> key;
  
  Rand::reseed(&r,0x2ea2);
  Blob<128>::Blob(&key);
  local_6c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&bins,0x200000,&local_6c,&local_a9);
  local_a8 = (double)CONCAT44(local_a8._4_4_,~(reps >> 0x1f) & reps);
  local_a0 = 0x10;
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
    if ((char)(((ushort)lVar2 & 0xff) % 0xc) == '\0') {
      putchar(0x2e);
    }
    lVar8 = (long)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start + local_a0;
    for (iVar9 = 0; iVar9 != local_a8._0_4_; iVar9 = iVar9 + 1) {
      Rand::rand_p(&r,&key,0x10);
      (*hash)(&key,0x10,0,&h1);
      flipbit<Blob<128>>(&key,(uint32_t)lVar2);
      (*hash)(&key,0x10,0,&h2);
      uVar5 = 1;
      lVar3 = lVar8;
      for (uVar4 = 0; uVar4 != 0x3f; uVar4 = uVar4 + 1) {
        lVar6 = lVar3 + (ulong)((uint)((h2 ^ h1) >> (uVar4 & 0x3f)) & 1) * 4;
        for (uVar7 = uVar5; uVar7 != 0x40; uVar7 = uVar7 + 1) {
          piVar1 = (int *)(lVar6 + (ulong)((uint)((h2 ^ h1) >> (uVar7 & 0x3f)) & 1) * 8);
          *piVar1 = *piVar1 + 1;
          lVar6 = lVar6 + 0x10;
        }
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0x410;
      }
    }
    local_a0 = local_a0 + 0x10000;
  }
  putchar(10);
  dVar16 = (double)(reps / 2);
  auVar12 = ZEXT864(0) << 0x40;
  uVar5 = 1;
  auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  local_98 = 0x10;
  uVar4 = 0;
  local_a0 = local_a0 & 0xffffffff00000000;
  local_b0 = 0;
  local_a8 = dVar16;
  for (uVar7 = 0; lVar2 = local_98, uVar10 = uVar5, uVar7 != 0x3f; uVar7 = uVar7 + 1) {
    for (; local_90 = uVar10, uVar5 != 0x40; uVar5 = uVar5 + 1) {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar7 & 0xffffffff,uVar5 & 0xffffffff);
        auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar12 = ZEXT864(auVar12._0_8_);
        dVar16 = local_a8;
      }
      local_88 = lVar2;
      for (uVar10 = 0; uVar10 != 0x80; uVar10 = uVar10 + 1) {
        auVar15 = ZEXT816(0) << 0x40;
        lVar8 = 0;
        while (lVar8 != 4) {
          lVar3 = lVar8 * 4;
          lVar8 = lVar8 + 1;
          auVar13._0_8_ =
               (double)*(int *)((long)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3 + lVar2) / dVar16;
          auVar13._8_8_ = in_XMM7_Qb;
          auVar13 = vfmadd213sd_fma(auVar13,auVar17._0_16_,auVar18._0_16_);
          auVar13 = vandpd_avx(auVar13,auVar19._0_16_);
          auVar15 = vmaxsd_avx(auVar13,auVar15);
        }
        dVar14 = auVar15._0_8_;
        if (auVar12._0_8_ < dVar14) {
          local_a0 = CONCAT44(local_a0._4_4_,(int)uVar5);
          uVar4 = uVar10 & 0xffffffff;
          auVar12 = ZEXT1664(auVar15);
          local_b0 = (uint)uVar7;
        }
        if (verbose) {
          iVar9 = 0x2e;
          if ((0.01 <= dVar14) && (iVar9 = 0x6f, 0.05 <= dVar14)) {
            iVar9 = (uint)(0.33 <= dVar14) * 9 + 0x4f;
          }
          putchar(iVar9);
          auVar12 = ZEXT864(auVar12._0_8_);
          auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
          dVar16 = local_a8;
        }
        lVar2 = lVar2 + 0x10000;
      }
      if (verbose) {
        putchar(10);
        auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar12 = ZEXT864((ulong)auVar12._0_8_);
        dVar16 = local_a8;
      }
      lVar2 = local_88 + 0x10;
      uVar10 = local_90;
    }
    if (verbose) {
      iVar9 = 0x8c;
      while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
        putchar(0x2d);
      }
      putchar(10);
      auVar12 = ZEXT864(auVar12._0_8_);
      auVar17 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar18 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar19 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      dVar16 = local_a8;
    }
    local_98 = local_98 + 0x410;
    uVar5 = local_90 + 1;
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar4,(ulong)local_b0,local_a0 & 0xffffffff);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bins.super__Vector_base<int,_std::allocator<int>_>);
  return auVar12._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}